

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O0

void printToken(char *path,VM *vm,char *sourceCode)

{
  uint local_bc;
  undefined1 local_b8 [4];
  uint32_t idx;
  parser parser;
  char *sourceCode_local;
  VM *vm_local;
  char *path_local;
  
  parser.vm = (VM *)sourceCode;
  initParser(vm,(Parser *)local_b8,path,sourceCode,(ObjModule *)0x0);
  while (parser._24_4_ != 0x36) {
    getNextToken((Parser *)local_b8);
    printf("%dL: %s [",(ulong)parser.curToken.start._4_4_,tokenArray[(uint)parser._24_4_]);
    local_bc = 0;
    while (local_bc < (uint)parser.curToken.start) {
      printf("%c",(ulong)(uint)(int)*(char *)(parser.curToken._0_8_ + (ulong)local_bc));
      local_bc = local_bc + 1;
    }
    printf("]\n");
  }
  return;
}

Assistant:

void printToken(const char *path, const VM *vm, const char *sourceCode) {
    struct parser parser;
    // TODO 模块先临时写NULL
    initParser(vm, &parser, path, sourceCode, NULL);
    while (parser.curToken.type != TOKEN_EOF) {
        getNextToken(&parser);
        printf("%dL: %s [", parser.curToken.lineNo, tokenArray[parser.curToken.type]);
        uint32_t idx = 0;
        while (idx < parser.curToken.length) {
            printf("%c", *(parser.curToken.start + idx++));
        }

        printf("]\n");
    }
}